

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidatorTests.cpp
# Opt level: O1

int testVisionFeatureScenePrintBasic(void)

{
  bool bVar1;
  ImageFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  Type *pTVar2;
  Type *pTVar3;
  ostream *poVar4;
  TypeUnion TVar5;
  VisionFeaturePrint_Scene *pVVar6;
  int iVar7;
  Result result;
  Model model;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  this = (ImageFeatureType *)operator_new(0x38);
  CoreML::Specification::ImageFeatureType::ImageFeatureType(this);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::clear_Type(this_00);
  this_00->_oneof_case_[0] = 4;
  (this_00->Type_).imagetype_ = this;
  this_01 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_01);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::clear_Type(this_02);
  this_02->_oneof_case_[0] = 5;
  (this_02->Type_).multiarraytype_ = this_01;
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_03->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_03->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  if (pTVar2->type_ != (FeatureType *)0x0) {
    (*(pTVar2->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar2->type_ = this_00;
  if (pTVar3->type_ != (FeatureType *)0x0) {
    (*(pTVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar3->type_ = this_02;
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ != (ModelDescription *)0x0) {
    (*((local_58.description_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  local_58.description_ = this_03;
  CoreML::validate<(MLModelType)2002>((Result *)local_a8,&local_58);
  bVar1 = CoreML::Result::good((Result *)local_a8);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((result).good())",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    iVar7 = 1;
    std::ostream::flush();
  }
  else {
    if (local_58._oneof_case_[0] != 0x7d2) {
      CoreML::Specification::Model::clear_Type(&local_58);
      local_58._oneof_case_[0] = 0x7d2;
      TVar5.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x20);
      CoreML::Specification::CoreMLModels::VisionFeaturePrint::VisionFeaturePrint
                (TVar5.visionfeatureprint_);
      local_58.Type_.pipelineclassifier_ = TVar5.pipelineclassifier_;
    }
    TVar5 = local_58.Type_;
    CoreML::validate<(MLModelType)2002>((Result *)local_80,&local_58);
    local_a8 = local_80;
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_a8);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((result).good())",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      if ((TVar5.treeensembleregressor_)->_cached_size_ != 0x14) {
        CoreML::Specification::CoreMLModels::VisionFeaturePrint::clear_VisionFeaturePrintType
                  (TVar5.visionfeatureprint_);
        (TVar5.treeensembleregressor_)->_cached_size_ = 0x14;
        pVVar6 = (VisionFeaturePrint_Scene *)operator_new(0x18);
        CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::VisionFeaturePrint_Scene
                  (pVVar6);
        ((VisionFeaturePrintTypeUnion *)&(TVar5.pipelineclassifier_)->pipeline_)->scene_ = pVVar6;
      }
      CoreML::validate<(MLModelType)2002>((Result *)local_80,&local_58);
      local_a8 = local_80;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      bVar1 = CoreML::Result::good((Result *)local_a8);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x31);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((result).good())",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      }
      else {
        if ((TVar5.treeensembleregressor_)->_cached_size_ != 0x14) {
          CoreML::Specification::CoreMLModels::VisionFeaturePrint::clear_VisionFeaturePrintType
                    (TVar5.visionfeatureprint_);
          (TVar5.treeensembleregressor_)->_cached_size_ = 0x14;
          pVVar6 = (VisionFeaturePrint_Scene *)operator_new(0x18);
          CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::VisionFeaturePrint_Scene
                    (pVVar6);
          ((VisionFeaturePrintTypeUnion *)&(TVar5.pipelineclassifier_)->pipeline_)->scene_ = pVVar6;
        }
        ((VisionFeaturePrintTypeUnion *)&(TVar5.pipelineclassifier_)->pipeline_)->scene_->version_ =
             1;
        CoreML::validate<(MLModelType)2002>((Result *)local_80,&local_58);
        local_a8 = local_80;
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        bVar1 = CoreML::Result::good((Result *)local_a8);
        iVar7 = 0;
        if (bVar1) goto LAB_001a0604;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(result).good()",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      }
    }
    std::ostream::put((char)poVar4);
    iVar7 = 1;
    std::ostream::flush();
  }
LAB_001a0604:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return iVar7;
}

Assistant:

int testVisionFeatureScenePrintBasic() {

    Specification::ImageFeatureType* inputImageFeatureType = new Specification::ImageFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_imagetype(inputImageFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *preprocessing = model.mutable_visionfeatureprint();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}